

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp
# Opt level: O0

IterateResult __thiscall
glcts::MultisampleTextureTexStorage2DValidCallsTest::iterate
          (MultisampleTextureTexStorage2DValidCallsTest *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestError *this_00;
  int local_a0;
  int n_samples;
  GLint max_samples;
  GLint internalformat_max_samples;
  GLenum internalformat;
  uint n_internalformat;
  undefined4 uStack_84;
  GLboolean fixedsamplelocations;
  uint n_fixedsamplelocations_value;
  uint n_fixedsamplelocations_values;
  GLboolean fixedsamplelocations_values [2];
  uint local_70;
  GLenum local_6c;
  uint n_internalformats;
  GLint max_iteration_specific_gl_samples_value;
  GLenum *internalformats;
  uint n_iteration;
  uint n_stencil_internalformats;
  uint n_depth_internalformats;
  uint n_color_internalformats;
  GLenum stencil_internalformats [2];
  GLenum depth_internalformats [3];
  GLenum color_internalformats [5];
  GLenum local_1c;
  GLint gl_max_depth_texture_samples_value;
  GLint gl_max_color_texture_samples_value;
  Functions *gl;
  MultisampleTextureTexStorage2DValidCallsTest *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  _gl_max_depth_texture_samples_value = CONCAT44(extraout_var,iVar1);
  initInternals(this);
  local_1c = 0;
  (**(code **)(_gl_max_depth_texture_samples_value + 0x868))(0x910e,&local_1c);
  dVar2 = (**(code **)(_gl_max_depth_texture_samples_value + 0x800))();
  glu::checkError(dVar2,"Could not retrieve GL_MAX_COLOR_TEXTURE_SAMPLES pname value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                  ,0x4b1);
  color_internalformats[4] = 0;
  (**(code **)(_gl_max_depth_texture_samples_value + 0x868))(0x910f,color_internalformats + 4);
  dVar2 = (**(code **)(_gl_max_depth_texture_samples_value + 0x800))();
  glu::checkError(dVar2,"Could not retrieve GL_MAX_DEPTH_TEXTURE_SAMPLES pname value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                  ,0x4b7);
  depth_internalformats[1] = 0x8229;
  depth_internalformats[2] = 0x8d62;
  color_internalformats[0] = 0x906f;
  color_internalformats[1] = 0x8c43;
  color_internalformats[2] = 0x8231;
  stencil_internalformats[0] = 0x81a5;
  stencil_internalformats[1] = 0x8cac;
  depth_internalformats[0] = 0x88f0;
  _n_depth_internalformats = 0x8cad000088f0;
  internalformats._4_4_ = 0;
  do {
    if (2 < internalformats._4_4_) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return STOP;
    }
    if (internalformats._4_4_ == 0) {
      _n_internalformats = depth_internalformats + 1;
      local_6c = local_1c;
      local_70 = 5;
    }
    else if (internalformats._4_4_ == 1) {
      _n_internalformats = stencil_internalformats;
      local_6c = color_internalformats[4];
      local_70 = 3;
    }
    else {
      if (internalformats._4_4_ != 2) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Unrecognized iteration index",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                   ,0x4e6);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      _n_internalformats = &n_depth_internalformats;
      local_6c = color_internalformats[4];
      local_70 = 2;
    }
    n_fixedsamplelocations_value._2_2_ = 0x100;
    uStack_84 = 2;
    for (n_internalformat = 0; n_internalformat < 2; n_internalformat = n_internalformat + 1) {
      internalformat._3_1_ =
           *(undefined1 *)((long)&n_fixedsamplelocations_value + (ulong)n_internalformat + 2);
      for (internalformat_max_samples = 0; (uint)internalformat_max_samples < local_70;
          internalformat_max_samples = internalformat_max_samples + 1) {
        max_samples = _n_internalformats[(uint)internalformat_max_samples];
        n_samples = 0;
        (**(code **)(_gl_max_depth_texture_samples_value + 0x880))
                  (0x9100,max_samples,0x80a9,1,&n_samples);
        dVar2 = (**(code **)(_gl_max_depth_texture_samples_value + 0x800))();
        glu::checkError(dVar2,"glGetInternalformativ() failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                        ,0x4ff);
        iVar1 = de::min<int>(n_samples,local_6c);
        iVar1 = de::max<int>(1,iVar1);
        for (local_a0 = 1; local_a0 <= iVar1; local_a0 = local_a0 + 1) {
          (**(code **)(_gl_max_depth_texture_samples_value + 0x1390))
                    (0x9100,local_a0,max_samples,1,1,internalformat._3_1_);
          dVar2 = (**(code **)(_gl_max_depth_texture_samples_value + 0x800))();
          glu::checkError(dVar2,"A valid glTexStorage2DMultisample() call failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                          ,0x50c);
          (**(code **)(_gl_max_depth_texture_samples_value + 0x480))(1,&this->to_id);
          (**(code **)(_gl_max_depth_texture_samples_value + 0x6f8))(1,&this->to_id);
          (**(code **)(_gl_max_depth_texture_samples_value + 0xb8))(0x9100,this->to_id);
          dVar2 = (**(code **)(_gl_max_depth_texture_samples_value + 0x800))();
          glu::checkError(dVar2,"Failed to re-create a texture object",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                          ,0x514);
        }
      }
    }
    internalformats._4_4_ = internalformats._4_4_ + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureTexStorage2DValidCallsTest::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	initInternals();

	/* Retrieve GL_MAX_COLOR_TEXTURE_SAMPLES pname value */
	glw::GLint gl_max_color_texture_samples_value = 0;

	gl.getIntegerv(GL_MAX_COLOR_TEXTURE_SAMPLES, &gl_max_color_texture_samples_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not retrieve GL_MAX_COLOR_TEXTURE_SAMPLES pname value");

	/* Retrieve GL_MAX_DEPTH_TEXTURE_SAMPLES pname value */
	glw::GLint gl_max_depth_texture_samples_value = 0;

	gl.getIntegerv(GL_MAX_DEPTH_TEXTURE_SAMPLES, &gl_max_depth_texture_samples_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not retrieve GL_MAX_DEPTH_TEXTURE_SAMPLES pname value");

	/* Iterate through color-, depth- and stencil-renderable internalformats */
	const glw::GLenum  color_internalformats[]   = { GL_R8, GL_RGB565, GL_RGB10_A2UI, GL_SRGB8_ALPHA8, GL_R8I };
	const glw::GLenum  depth_internalformats[]   = { GL_DEPTH_COMPONENT16, GL_DEPTH_COMPONENT32F, GL_DEPTH24_STENCIL8 };
	const glw::GLenum  stencil_internalformats[] = { GL_DEPTH24_STENCIL8, GL_DEPTH32F_STENCIL8 };
	const unsigned int n_color_internalformats   = sizeof(color_internalformats) / sizeof(color_internalformats[0]);
	const unsigned int n_depth_internalformats   = sizeof(depth_internalformats) / sizeof(depth_internalformats[0]);
	const unsigned int n_stencil_internalformats = sizeof(stencil_internalformats) / sizeof(stencil_internalformats[0]);

	for (unsigned int n_iteration = 0; n_iteration < 3 /* color/depth/stencil */; ++n_iteration)
	{
		const glw::GLenum* internalformats						   = NULL;
		glw::GLint		   max_iteration_specific_gl_samples_value = 0;
		unsigned int	   n_internalformats					   = 0;

		switch (n_iteration)
		{
		case 0:
		{
			internalformats							= color_internalformats;
			max_iteration_specific_gl_samples_value = gl_max_color_texture_samples_value;
			n_internalformats						= n_color_internalformats;

			break;
		}

		case 1:
		{
			internalformats							= depth_internalformats;
			max_iteration_specific_gl_samples_value = gl_max_depth_texture_samples_value;
			n_internalformats						= n_depth_internalformats;

			break;
		}

		case 2:
		{
			internalformats							= stencil_internalformats;
			max_iteration_specific_gl_samples_value = gl_max_depth_texture_samples_value;
			n_internalformats						= n_stencil_internalformats;

			break;
		}

		default:
		{
			TCU_FAIL("Unrecognized iteration index");
		}
		} /* switch (n_iteration) */

		/* Iterate through valid fixedsamplelocations argument values */
		const glw::GLboolean fixedsamplelocations_values[] = { GL_FALSE, GL_TRUE };
		const unsigned int   n_fixedsamplelocations_values =
			sizeof(fixedsamplelocations_values) / sizeof(fixedsamplelocations_values[0]);

		for (unsigned int n_fixedsamplelocations_value = 0;
			 n_fixedsamplelocations_value < n_fixedsamplelocations_values; ++n_fixedsamplelocations_value)
		{
			glw::GLboolean fixedsamplelocations = fixedsamplelocations_values[n_fixedsamplelocations_value];

			/* Iterate through internalformats */
			for (unsigned int n_internalformat = 0; n_internalformat < n_internalformats; ++n_internalformat)
			{
				glw::GLenum internalformat			   = internalformats[n_internalformat];
				glw::GLint  internalformat_max_samples = 0;

				/* Retrieve internalformat-specific GL_MAX_SAMPLES value */
				gl.getInternalformativ(GL_TEXTURE_2D_MULTISAMPLE,	 /* target */
									   internalformat, GL_SAMPLES, 1, /* bufSize */
									   &internalformat_max_samples);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetInternalformativ() failed");

				/* Determine maximum amount of samples we can use for the test*/
				glw::GLint max_samples =
					de::max(1, de::min(internalformat_max_samples, max_iteration_specific_gl_samples_value));

				/* Iterate through all valid samples argument values */
				for (int n_samples = 1; n_samples <= max_samples; ++n_samples)
				{
					gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, n_samples, internalformat, 1, /* width */
											   1,														/* height */
											   fixedsamplelocations); /* fixedsamplelocations */

					GLU_EXPECT_NO_ERROR(gl.getError(), "A valid glTexStorage2DMultisample() call failed");

					/* Re-create the texture object before we continue */
					gl.deleteTextures(1, &to_id);
					gl.genTextures(1, &to_id);

					gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, to_id);

					GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to re-create a texture object");
				} /* for (all samples argument values) */
			}	 /* for (all color-renderable internalformats) */
		}		  /* for (all fixedsamplelocations argument values) */
	}			  /* for (all iterations) */

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}